

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BMPReader.h
# Opt level: O2

void __thiscall BMPReader::~BMPReader(BMPReader *this)

{
  ostream *poVar1;
  
  if (this->rgbData != (RGB *)0x0) {
    operator_delete__(this->rgbData);
    this->rgbData = (RGB *)0x0;
    poVar1 = std::operator<<((ostream *)&std::cout,"Delete BMPReader::rgbData");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

~BMPReader() {
		if (rgbData) {
			delete[] rgbData; 
			rgbData = nullptr;
			std::cout << "Delete BMPReader::rgbData" << std::endl;
		}
	}